

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KktChStep.cpp
# Opt level: O0

void __thiscall KktChStep::makeKKTCheck(KktChStep *this)

{
  reference pvVar1;
  reference pvVar2;
  KktCheck *in_RDI;
  int i_1;
  int i;
  int k;
  vector<double,_std::allocator<double>_> rD;
  vector<double,_std::allocator<double>_> cD;
  vector<double,_std::allocator<double>_> cV;
  KktCheck checker;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffda8;
  KktCheck *in_stack_fffffffffffffdb0;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffdb8;
  KktCheck *in_stack_fffffffffffffdc0;
  undefined8 in_stack_fffffffffffffdc8;
  vector<double,_std::allocator<double>_> *__new_size;
  int local_21c;
  int local_218;
  int local_214;
  vector<double,_std::allocator<double>_> local_210;
  vector<double,_std::allocator<double>_> local_1f8;
  vector<double,_std::allocator<double>_> local_1e0 [10];
  KktCheck *in_stack_ffffffffffffff18;
  KktChStep *in_stack_ffffffffffffff20;
  KktCheck *in_stack_ffffffffffffffc0;
  
  KktCheck::KktCheck(in_stack_fffffffffffffdb0);
  resizeProblemMatrix(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  KktCheck::setMatrix(in_stack_fffffffffffffdc0,
                      (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffdb8,
                      (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffdb0,
                      in_stack_fffffffffffffda8);
  KktCheck::setBounds(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
                      (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffdb0);
  KktCheck::setNumbersCostRHS
            (in_RDI,(int)((ulong)in_stack_fffffffffffffdc8 >> 0x20),(int)in_stack_fffffffffffffdc8,
             (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffdc0,
             in_stack_fffffffffffffdb8,
             (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffdb0);
  __new_size = local_1e0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x1c3a8a);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x1c3a94);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x1c3a9e);
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)in_RDI,(size_type)__new_size);
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)in_RDI,(size_type)__new_size);
  local_214 = 0;
  for (local_218 = 0; local_218 < in_RDI->numCol; local_218 = local_218 + 1) {
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->ARstart,(long)local_218);
    if (*pvVar1 != 0) {
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)
                          &in_RDI[1].Astart.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,(long)local_218);
      in_stack_fffffffffffffdb8 = (vector<double,_std::allocator<double>_> *)*pvVar2;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](local_1e0,(long)local_214);
      *pvVar2 = (value_type)in_stack_fffffffffffffdb8;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)
                          &in_RDI[1].Aindex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,(long)local_218);
      in_stack_fffffffffffffdc0 = (KktCheck *)*pvVar2;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_1f8,(long)local_214);
      *pvVar2 = (value_type)in_stack_fffffffffffffdc0;
      local_214 = local_214 + 1;
    }
  }
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)in_RDI,(size_type)__new_size);
  local_214 = 0;
  for (local_21c = 0; local_21c < in_RDI->numRow; local_21c = local_21c + 1) {
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->ARindex,(long)local_21c);
    if (*pvVar1 != 0) {
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)
                          &in_RDI[1].Avalue.super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_21c);
      in_stack_fffffffffffffdb0 = (KktCheck *)*pvVar2;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_210,(long)local_214);
      *pvVar2 = (value_type)in_stack_fffffffffffffdb0;
      local_214 = local_214 + 1;
    }
  }
  KktCheck::passSolution
            (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
             (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffdb0,
             in_stack_fffffffffffffda8);
  KktCheck::checkKKT(in_stack_ffffffffffffffc0);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffdc0);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffdc0);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffdc0);
  KktCheck::~KktCheck(in_stack_fffffffffffffdb0);
  return;
}

Assistant:

void KktChStep::makeKKTCheck() {
	KktCheck checker;
	resizeProblemMatrix(checker);
	//KktCheck checker;
	checker.setMatrix(Astart, Aindex, Avalue);
	checker.setBounds(colUpper, colLower);
	checker.setNumbersCostRHS(numCol, numRow, rowLower, rowUpper, colCost);
	if (print) 	
		checker.print = print;
	
	//resize and pass solutions
	vector<double> cV;
    vector<double> cD;
    vector<double> rD;
    
    cV.resize(numCol);
    cD.resize(numCol);    
    
    int k=0;
    for (int i=0;i<RnumCol;i++)
    	if (flagCol[i]) {
    		cV[k]  = colValue[i];
    		cD[k] = colDual[i];
    		k++;
	    }
    
    rD.resize(numRow);
    k=0;
    for (int i=0;i<RnumRow;i++)
    	if (flagRow[i]) {
    		rD[k] = rowDual[i];
    		k++;
	    }
	
	
	
	checker.passSolution(cV, cD, rD);
	checker.checkKKT();
	}